

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_hash_table.hpp
# Opt level: O2

uint64_t __thiscall
poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::copy_from_right_
          (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *this,
          uint64_t slot_id)

{
  bool bVar1;
  uint64_t uVar2;
  ulong i;
  
  i = slot_id + 1 & (this->capa_size_).mask_;
  uVar2 = compact_vector::get(&this->table_,i);
  bVar1 = get_vbit_(this,slot_id);
  compact_vector::set(&this->table_,slot_id,(uVar2 & 0xfffffffffffffffd) + (ulong)bVar1 * 2);
  return i;
}

Assistant:

uint64_t copy_from_right_(uint64_t slot_id) {
        uint64_t _slot_id = right_(slot_id);
        table_.set(slot_id, (table_.get(_slot_id) & ~2ULL) | (get_vbit_(slot_id) << 1));
        return _slot_id;
    }